

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

Vec_Int_t * Dau_DecFindSets_int(word *pInit,int nVars,int **pSched)

{
  int iVar1;
  uint Entry;
  Vec_Int_t *vSets_00;
  word local_2108;
  word p [1024];
  uint setMixed;
  int maskS;
  int maskB;
  int sizeS;
  int sizeB;
  int v;
  int c;
  int Limit;
  int pVarsB [16];
  int P2V [16];
  int V2P [16];
  Vec_Int_t *vSets;
  int **pSched_local;
  int nVars_local;
  word *pInit_local;
  
  vSets_00 = Vec_IntAlloc(0x20);
  iVar1 = Abc_TtWordNum(nVars);
  memcpy(&local_2108,pInit,(long)iVar1 << 3);
  sizeS = 0;
  while( true ) {
    if (nVars <= sizeS) {
      for (sizeS = 0; sizeS < nVars; sizeS = sizeS + 1) {
        pVarsB[(long)sizeS + 0xe] = sizeS;
        P2V[(long)sizeS + 0xe] = sizeS;
      }
      for (maskB = 2; maskB < nVars; maskB = maskB + 1) {
        for (setMixed = 0; (int)setMixed < 1 << ((byte)nVars & 0x1f); setMixed = setMixed + 1) {
          iVar1 = Abc_TtBitCount16(setMixed);
          if (iVar1 == maskB) {
            Dau_DecMoveFreeToLSB(&local_2108,nVars,P2V + 0xe,pVarsB + 0xe,setMixed,maskB);
            for (sizeB = 0; sizeB < maskB; sizeB = sizeB + 1) {
              (&c)[sizeB] = pVarsB[(long)((nVars - maskB) + sizeB) + 0xe];
            }
            iVar1 = Dau_DecCheckSetTop(&local_2108,nVars,nVars - maskB,maskB,0,0,pSched[maskB],
                                       (word *)0x0,(word *)0x0);
            if (iVar1 == 0) {
              if (maskB != 2) {
                for (maskS = 1; maskS <= maskB + -2; maskS = maskS + 1) {
                  if (maskS < 4) {
                    for (p[0x3ff]._4_4_ = 0; p[0x3ff]._4_4_ < 1 << ((byte)maskB & 0x1f);
                        p[0x3ff]._4_4_ = p[0x3ff]._4_4_ + 1) {
                      iVar1 = Abc_TtBitCount16(p[0x3ff]._4_4_);
                      if (iVar1 == maskS) {
                        p[0x3ff]._0_4_ = Dau_DecCreateSet(&c,maskB,p[0x3ff]._4_4_);
                        iVar1 = Dau_DecSetIsContained(vSets_00,(uint)p[0x3ff]);
                        if ((iVar1 == 0) &&
                           (iVar1 = Dau_DecCheckSetTop(&local_2108,nVars,nVars - maskB,maskB,maskS,
                                                       p[0x3ff]._4_4_,pSched[maskB],(word *)0x0,
                                                       (word *)0x0), iVar1 != 0)) {
                          Vec_IntPush(vSets_00,(uint)p[0x3ff]);
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              Entry = Dau_DecCreateSet(&c,maskB,0);
              Vec_IntPush(vSets_00,Entry);
            }
          }
        }
      }
      return vSets_00;
    }
    iVar1 = Abc_TtHasVar(&local_2108,nVars,sizeS);
    if (iVar1 == 0) break;
    sizeS = sizeS + 1;
  }
  __assert_fail("Abc_TtHasVar( p, nVars, v )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                ,0x1d8,"Vec_Int_t *Dau_DecFindSets_int(word *, int, int **)");
}

Assistant:

Vec_Int_t * Dau_DecFindSets_int( word * pInit, int nVars, int * pSched[16] )
{
    Vec_Int_t * vSets = Vec_IntAlloc( 32 );
    int V2P[16], P2V[16], pVarsB[16];
    int Limit = (1 << nVars);
    int c, v, sizeB, sizeS, maskB, maskS;
    unsigned setMixed;
    word p[1<<10]; 
    memcpy( p, pInit, sizeof(word) * Abc_TtWordNum(nVars) );
    for ( v = 0; v < nVars; v++ )
        assert( Abc_TtHasVar( p, nVars, v ) );
    // initialize permutation
    for ( v = 0; v < nVars; v++ )
        V2P[v] = P2V[v] = v;
    // iterate through bound sets of each size in increasing order
    for ( sizeB = 2; sizeB < nVars; sizeB++ ) // bound set size
    for ( maskB = 0; maskB < Limit; maskB++ ) // bound set
    if ( Abc_TtBitCount16(maskB) == sizeB )
    {
        // permute variables to have bound set on top
        Dau_DecMoveFreeToLSB( p, nVars, V2P, P2V, maskB, sizeB );
        // collect bound set vars on levels nVars-sizeB to nVars-1
        for ( c = 0; c < sizeB; c++ )
            pVarsB[c] = P2V[nVars-sizeB+c];
        // check disjoint
//        if ( Dau_DecCheckSetTopOld(p, nVars, nVars-sizeB, sizeB, 0, 0, NULL, NULL, NULL) )
        if ( Dau_DecCheckSetTop(p, nVars, nVars-sizeB, sizeB, 0, 0, pSched[sizeB], NULL, NULL) )
        {
            Vec_IntPush( vSets, Dau_DecCreateSet(pVarsB, sizeB, 0) );
            continue;
        }
        if ( sizeB == 2 )
            continue;
        // iterate through shared sets of each size in the increasing order
        for ( sizeS = 1; sizeS <= sizeB - 2; sizeS++ )   // shared set size
        if ( sizeS <= 3 )
//        sizeS = 1; 
        for ( maskS = 0; maskS < (1 << sizeB); maskS++ ) // shared set
        if ( Abc_TtBitCount16(maskS) == sizeS )
        {
            setMixed = Dau_DecCreateSet( pVarsB, sizeB, maskS );
//            printf( "Considering %10d ", setMixed );
//            Dau_DecPrintSet( setMixed, nVars );
            // check if it exists
            if ( Dau_DecSetIsContained(vSets, setMixed) )
                continue;
            // check if it can be added
//            if ( Dau_DecCheckSetTopOld(p, nVars, nVars-sizeB, sizeB, sizeS, maskS, NULL, NULL, NULL) )
            if ( Dau_DecCheckSetTop(p, nVars, nVars-sizeB, sizeB, sizeS, maskS, pSched[sizeB], NULL, NULL) )
                Vec_IntPush( vSets, setMixed );
        }
    }
    return vSets;
}